

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall
ConfidentialTxOut_Constractor3_Test::TestBody(ConfidentialTxOut_Constractor3_Test *this)

{
  bool *pbVar1;
  undefined1 auVar2 [8];
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  pointer puVar5;
  char *pcVar6;
  ulong uVar7;
  size_t sVar8;
  Amount AVar9;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_8;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  undefined1 local_2a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  undefined1 local_288 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278 [2];
  string local_250;
  int local_230 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  ConfidentialTxOutReference local_220;
  ConfidentialTxOut local_128;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_128,&exp_asset,&exp_value);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&local_220,&local_128.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_288,(ConfidentialAssetId *)&local_220);
  auVar2 = local_288;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_2a8,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_250,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()"
             ,(char *)auVar2,(char *)local_2a8);
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8);
  }
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288);
  }
  local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialAssetId_0068d228;
  if ((long *)local_220.super_AbstractTxOutReference.value_.amount_ != (long *)0x0) {
    operator_delete((void *)local_220.super_AbstractTxOutReference.value_.amount_);
  }
  if ((char)local_250._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_220);
    if ((undefined8 *)local_250._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_250._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x80,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_288,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_288);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_250._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&local_220,&local_128.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_288,(ConfidentialValue *)&local_220);
  auVar2 = local_288;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_2a8,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_250,"txout.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)auVar2,(char *)local_2a8);
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8);
  }
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288);
  }
  local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialValue_0068d0c0;
  if ((long *)local_220.super_AbstractTxOutReference.value_.amount_ != (long *)0x0) {
    operator_delete((void *)local_220.super_AbstractTxOutReference.value_.amount_);
  }
  if ((char)local_250._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_220);
    if ((undefined8 *)local_250._M_string_length == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_250._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x82,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_288,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_288);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_250._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)&local_220,&local_128.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_288,(Script *)&local_220);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2a8,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_288,"");
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288);
  }
  cfd::core::Script::~Script((Script *)&local_220);
  if (local_2a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_220);
    if (sStack_2a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = *(char **)sStack_2a0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x83,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_288,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_288);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)&local_220,&local_128.nonce_)
  ;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_288,(ConfidentialNonce *)&local_220);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2a8,"txout.GetNonce().GetHex().c_str()","\"\"",(char *)local_288,"");
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288);
  }
  local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
       (_func_int **)&PTR__ConfidentialNonce_0068d410;
  if ((long *)local_220.super_AbstractTxOutReference.value_.amount_ != (long *)0x0) {
    operator_delete((void *)local_220.super_AbstractTxOutReference.value_.amount_);
  }
  if (local_2a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_220);
    if (sStack_2a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = *(char **)sStack_2a0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x84,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_288,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_288);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_288 = (undefined1  [8])0x0;
  sStack_280.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_278[0]._M_allocated_capacity = 0;
  uVar7 = (long)local_128.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar7 == 0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar7 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar7);
    sVar8 = (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_278[0]._0_8_ = uVar7 + (long)pbVar4;
  local_288 = (undefined1  [8])pbVar4;
  if (local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sStack_280.ptr_ = pbVar4;
    memmove(pbVar4,local_128.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  sStack_280.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar4->_M_dataplus)._M_p + sVar8);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_220,(ByteData *)local_288);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2a8,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference,"");
  pbVar1 = &local_220.super_AbstractTxOutReference.value_.ignore_check_;
  if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288);
  }
  if (local_2a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_220);
    if (sStack_2a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = *(char **)sStack_2a0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x85,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_288,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_288);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_288 = (undefined1  [8])0x0;
  sStack_280.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_278[0]._M_allocated_capacity = 0;
  uVar7 = (long)local_128.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_128.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar7 == 0) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar7 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar7);
    sVar8 = (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_128.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_278[0]._0_8_ = uVar7 + (long)pbVar4;
  local_288 = (undefined1  [8])pbVar4;
  if (local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_128.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_280.ptr_ = pbVar4;
    memmove(pbVar4,local_128.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  sStack_280.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar4->_M_dataplus)._M_p + sVar8);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_220,(ByteData *)local_288);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2a8,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference,"");
  if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288);
  }
  if (local_2a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_220);
    if (sStack_2a0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = *(char **)sStack_2a0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x86,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_288,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_288);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  AVar9 = cfd::core::AbstractTxOut::GetValue(&local_128.super_AbstractTxOut);
  local_288 = (undefined1  [8])AVar9.amount_;
  sStack_280.ptr_._0_1_ = AVar9.ignore_check_;
  local_2a8 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue((Amount *)local_288);
  local_250._M_dataplus._M_p = (pointer)((ulong)local_250._M_dataplus._M_p._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)&local_220,"txout.GetValue().GetSatoshiValue()","0",(long *)local_2a8,
             (int *)&local_250);
  if ((char)local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference == '\0') {
    testing::Message::Message((Message *)local_288);
    if ((long *)local_220.super_AbstractTxOutReference.value_.amount_ == (long *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_220.super_AbstractTxOutReference.value_.amount_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x87,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
    if (local_288 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_288 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_288 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_220.super_AbstractTxOutReference.value_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOut::GetWitnessHash((ByteData256 *)local_288,&local_128);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_220,(ByteData256 *)local_288);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2a8,"txout.GetWitnessHash().GetHex().c_str()",
             "\"7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5\"",
             (char *)local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference,
             "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");
  if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)pbVar1) {
    operator_delete(local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference);
  }
  if (local_288 != (undefined1  [8])0x0) {
    operator_delete((void *)local_288);
  }
  if (local_2a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_220);
    if (sStack_2a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)sStack_2a0.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x89,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_288,(Message *)&local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_288);
    if (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference != (_func_int **)0x0))
      {
        (**(code **)(*local_220.super_AbstractTxOutReference._vptr_AbstractTxOutReference + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_2a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference(&local_220,&local_128);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_288,&local_220.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_2a8,(ConfidentialAssetId *)local_288);
  auVar2 = local_2a8;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_250,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",(char *)auVar2,local_250._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8);
  }
  local_288 = (undefined1  [8])&PTR__ConfidentialAssetId_0068d228;
  if (sStack_280.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_280.ptr_);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_288);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x8d,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
    if (local_288 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_288 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_288 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_288,&local_220.confidential_value_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_2a8,(ConfidentialValue *)local_288);
  auVar2 = local_2a8;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_250,&exp_value);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)auVar2,local_250._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8);
  }
  local_288 = (undefined1  [8])&PTR__ConfidentialValue_0068d0c0;
  if (sStack_280.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_280.ptr_);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_288);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x8f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
    if (local_288 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_288 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_288 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script
            ((Script *)local_288,&local_220.super_AbstractTxOutReference.locking_script_);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_2a8,(Script *)local_288);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_250,"txout_ref.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_2a8,"");
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8);
  }
  cfd::core::Script::~Script((Script *)local_288);
  if ((char)local_250._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_288);
    if ((undefined8 *)local_250._M_string_length != (undefined8 *)0x0) {
      pcVar6 = *(char **)local_250._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x90,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
    if (local_288 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_288 != (undefined1  [8])0x0)) {
        (**(code **)(*(undefined **)local_288 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_250._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_288,&local_220.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_2a8,(ConfidentialNonce *)local_288);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_250,"txout_ref.GetNonce().GetHex().c_str()","\"\"",(char *)local_2a8
             ,"");
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8);
  }
  local_288 = (undefined1  [8])&PTR__ConfidentialNonce_0068d410;
  if (sStack_280.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(sStack_280.ptr_);
  }
  if ((char)local_250._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_288);
    if ((undefined8 *)local_250._M_string_length != (undefined8 *)0x0) {
      pcVar6 = *(char **)local_250._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x91,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
    if (local_288 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_288 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_250._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2a8 = (undefined1  [8])0x0;
  sStack_2a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_298._M_allocated_capacity = 0;
  uVar7 = (long)local_220.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_220.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar7 == 0) {
    puVar5 = (pointer)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar7 < 0) {
      std::__throw_bad_alloc();
    }
    puVar5 = (pointer)operator_new(uVar7);
    sVar8 = (long)local_220.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_220.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_298._M_allocated_capacity = (size_type)(puVar5 + uVar7);
  local_2a8 = (undefined1  [8])puVar5;
  if (local_220.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_220.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sStack_2a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5;
    memmove(puVar5,local_220.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  sStack_2a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar5 + sVar8);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_288,(ByteData *)local_2a8);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_250,"txout_ref.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_288,"");
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288);
  }
  if (local_2a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2a8);
  }
  if ((char)local_250._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_288);
    if ((undefined8 *)local_250._M_string_length != (undefined8 *)0x0) {
      pcVar6 = *(char **)local_250._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x92,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
    if (local_288 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_288 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_250._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2a8 = (undefined1  [8])0x0;
  sStack_2a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_298._M_allocated_capacity = 0;
  uVar7 = (long)local_220.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_220.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar7 == 0) {
    puVar5 = (pointer)0x0;
    sVar8 = 0;
  }
  else {
    if ((long)uVar7 < 0) {
      std::__throw_bad_alloc();
    }
    puVar5 = (pointer)operator_new(uVar7);
    sVar8 = (long)local_220.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_220.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_298._M_allocated_capacity = (size_type)(puVar5 + uVar7);
  local_2a8 = (undefined1  [8])puVar5;
  if (local_220.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_220.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_2a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar5;
    memmove(puVar5,local_220.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar8);
  }
  sStack_2a0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar5 + sVar8);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_288,(ByteData *)local_2a8);
  pcVar6 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_250,"txout_ref.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_288,"");
  if (local_288 != (undefined1  [8])local_278) {
    operator_delete((void *)local_288);
  }
  if (local_2a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_2a8);
  }
  if ((char)local_250._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_288);
    if ((undefined8 *)local_250._M_string_length != (undefined8 *)0x0) {
      pcVar6 = *(char **)local_250._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x93,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2a8,(Message *)local_288);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2a8);
    if (local_288 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_288 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_288 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_250._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2a8 = (undefined1  [8])local_220.super_AbstractTxOutReference.value_.amount_;
  sStack_2a0.ptr_._0_1_ = local_220.super_AbstractTxOutReference.value_.ignore_check_;
  local_250._M_dataplus._M_p = (pointer)cfd::core::Amount::GetSatoshiValue((Amount *)local_2a8);
  local_230[0] = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_288,"txout_ref.GetValue().GetSatoshiValue()","0",(long *)&local_250,
             local_230);
  if (local_288[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2a8);
    if (sStack_280.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((sStack_280.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x94,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_250,(Message *)local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_250);
    if (local_2a8 != (undefined1  [8])0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2a8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_2a8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_280,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(&local_220);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_128);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor3) {
  // ConfidentialAssetId, ConfidentialValue
  ConfidentialTxOut txout(exp_asset, exp_value);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "7d993a3ac51b76589a07c59078e2e4241f4c13c5190a763f22213e0c9ed8e7d5");

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}